

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int bitset_container_number_of_runs(bitset_container_t *bc)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar2 = 0;
  lVar3 = 1;
  uVar4 = *bc->words;
  do {
    uVar1 = bc->words[lVar3];
    uVar5 = uVar4 * 2 & ~uVar4;
    uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
    uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
    iVar2 = ((uint)(uVar4 >> 0x3f) & ~(uint)uVar1) + iVar2 +
            (uint)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    lVar3 = lVar3 + 1;
    uVar4 = uVar1;
  } while (lVar3 != 0x400);
  uVar4 = uVar1 * 2 & ~uVar1;
  uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  return (iVar2 - (int)((long)uVar1 >> 0x3f)) +
         (uint)(byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
}

Assistant:

int bitset_container_number_of_runs(bitset_container_t *bc) {
  int num_runs = 0;
  uint64_t next_word = bc->words[0];

  for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS-1; ++i) {
    uint64_t word = next_word;
    next_word = bc->words[i+1];
    num_runs += roaring_hamming((~word) & (word << 1)) + ( (word >> 63) & ~next_word);
  }

  uint64_t word = next_word;
  num_runs += roaring_hamming((~word) & (word << 1));
  if((word & 0x8000000000000000ULL) != 0)
    num_runs++;
  return num_runs;
}